

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

int xmlNodeDump(xmlBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,int level,int format)

{
  int iVar1;
  xmlBufPtr buf_00;
  size_t sVar2;
  int level_00;
  size_t sVar3;
  
  sVar3 = 0xffffffff;
  if (cur != (xmlNodePtr)0x0 && buf != (xmlBufferPtr)0x0) {
    buf_00 = xmlBufFromBuffer(buf);
    if (buf_00 != (xmlBufPtr)0x0) {
      iVar1 = 100;
      if (level < 100) {
        iVar1 = level;
      }
      level_00 = 0;
      if (0 < iVar1) {
        level_00 = iVar1;
      }
      sVar2 = xmlBufNodeDump(buf_00,doc,cur,level_00,format);
      iVar1 = xmlBufBackToBuffer(buf_00,buf);
      if (((sVar2 != 0xffffffffffffffff) && (-1 < iVar1)) &&
         (sVar3 = 0x7fffffff, sVar2 < 0x7fffffff)) {
        sVar3 = sVar2;
      }
    }
  }
  return (int)sVar3;
}

Assistant:

int
xmlNodeDump(xmlBufferPtr buf, xmlDocPtr doc, xmlNodePtr cur, int level,
            int format)
{
    xmlBufPtr buffer;
    size_t ret1;
    int ret2;

    if ((buf == NULL) || (cur == NULL))
        return(-1);
    if (level < 0)
        level = 0;
    else if (level > 100)
        level = 100;
    buffer = xmlBufFromBuffer(buf);
    if (buffer == NULL)
        return(-1);
    ret1 = xmlBufNodeDump(buffer, doc, cur, level, format);
    ret2 = xmlBufBackToBuffer(buffer, buf);
    if ((ret1 == (size_t) -1) || (ret2 < 0))
        return(-1);
    return(ret1 > INT_MAX ? INT_MAX : ret1);
}